

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O3

vector<Tetris,_std::allocator<Tetris>_> * __thiscall
GameBoard::getPlaces
          (GameBoard *this,int id,int blockType,vector<Tetris,_std::allocator<Tetris>_> *ans,
          bool unique)

{
  int *piVar1;
  iterator __position;
  bool bVar2;
  uint uVar3;
  int *piVar4;
  int o;
  long lVar5;
  vector<Tetris,std::allocator<Tetris>> *this_00;
  ulong unaff_RBP;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  int y;
  int iVar12;
  queue<Tetris,_std::deque<Tetris,_std::allocator<Tetris>_>_> q;
  Tetris local_d0;
  vector<Tetris,std::allocator<Tetris>> *local_a8;
  int local_9c;
  _Deque_base<Tetris,_std::allocator<Tetris>_> local_98;
  ulong local_48;
  int (*local_40) [4];
  int (*local_38) [4];
  
  local_98._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_a8 = (vector<Tetris,std::allocator<Tetris>> *)ans;
  std::_Deque_base<Tetris,_std::allocator<Tetris>_>::_M_initialize_map(&local_98,0);
  memset(getPlaces::vis,0,0x420);
  local_d0.shape = blockShape[blockType];
  piVar4 = this->gridInfo[id][0x14] + 1;
  iVar10 = 0x14;
  do {
    iVar12 = iVar10;
    uVar6 = 0;
    do {
      piVar1 = piVar4 + uVar6;
      uVar6 = uVar6 + 1;
      if (9 < uVar6) break;
    } while (*piVar1 == 0);
    piVar4 = piVar4 + -0xc;
    iVar10 = iVar12 + -1;
    if (*piVar1 != 0) {
      local_48 = (ulong)(iVar12 + 1);
      uVar6 = 0;
      local_38 = blockHalfHeight + blockType;
      local_40 = blockHeight + blockType;
      local_d0.gameBoard = this;
      local_d0.blockType = blockType;
      local_d0.color = id;
      local_9c = blockType;
      do {
        uVar3 = ((*local_38)[uVar6] - (*local_40)[uVar6]) + 0x15;
        uVar8 = (*local_40)[uVar6] + (int)local_48;
        if ((int)uVar3 <= (int)uVar8) {
          uVar8 = uVar3;
        }
        uVar3 = 1;
        do {
          unaff_RBP = unaff_RBP & 0xffffffff;
          if (uVar8 != 0xffffffff) {
            unaff_RBP = (ulong)uVar8;
          }
          local_d0.blockX = (int)unaff_RBP;
          local_d0.orientation = (int)uVar6;
          local_d0.blockY = uVar3;
          bVar2 = Tetris::isValid(&local_d0,-1,-1,-1);
          uVar7 = uVar6 & 0xffffffff;
          uVar11 = (ulong)uVar3;
          if (bVar2) {
            if (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_98._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
              std::deque<Tetris,std::allocator<Tetris>>::_M_push_back_aux<Tetris_const&>
                        ((deque<Tetris,std::allocator<Tetris>> *)&local_98,&local_d0);
            }
            else {
              *(ulong *)&(local_98._M_impl.super__Deque_impl_data._M_finish._M_cur)->color =
                   CONCAT44(local_d0._36_4_,local_d0.color);
              (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur)->blockY = local_d0.blockY;
              (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur)->orientation =
                   local_d0.orientation;
              (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur)->shape = local_d0.shape;
              (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur)->gameBoard =
                   local_d0.gameBoard;
              (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur)->blockType =
                   local_d0.blockType;
              (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur)->blockX = local_d0.blockX;
              local_98._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_98._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
            }
            unaff_RBP = (ulong)local_d0.blockX;
            uVar11 = (ulong)local_d0.blockY;
            uVar7 = (ulong)local_d0.orientation;
            getPlaces::vis[unaff_RBP][uVar11][uVar7] = true;
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 != 0xb);
        uVar6 = uVar6 + 1;
        this_00 = local_a8;
      } while (uVar6 != 4);
      do {
        do {
          do {
            local_d0.blockX = (uint)unaff_RBP;
            if ((local_98._M_impl.super__Deque_impl_data._M_start._M_cur)->blockX != 0xffffffff) {
              local_d0.blockX = (local_98._M_impl.super__Deque_impl_data._M_start._M_cur)->blockX;
            }
            local_d0.blockY = (int)uVar11;
            if ((local_98._M_impl.super__Deque_impl_data._M_start._M_cur)->blockY != -1) {
              local_d0.blockY = (local_98._M_impl.super__Deque_impl_data._M_start._M_cur)->blockY;
            }
            local_d0.orientation = (uint)uVar7;
            if ((local_98._M_impl.super__Deque_impl_data._M_start._M_cur)->orientation != 0xffffffff
               ) {
              local_d0.orientation =
                   (local_98._M_impl.super__Deque_impl_data._M_start._M_cur)->orientation;
            }
            if (local_98._M_impl.super__Deque_impl_data._M_start._M_cur ==
                local_98._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
              operator_delete(local_98._M_impl.super__Deque_impl_data._M_start._M_first);
              local_98._M_impl.super__Deque_impl_data._M_start._M_cur =
                   local_98._M_impl.super__Deque_impl_data._M_start._M_node[1];
              local_98._M_impl.super__Deque_impl_data._M_start._M_last =
                   local_98._M_impl.super__Deque_impl_data._M_start._M_cur + 0xc;
              local_98._M_impl.super__Deque_impl_data._M_start._M_first =
                   local_98._M_impl.super__Deque_impl_data._M_start._M_cur;
              local_98._M_impl.super__Deque_impl_data._M_start._M_node =
                   local_98._M_impl.super__Deque_impl_data._M_start._M_node + 1;
            }
            else {
              local_98._M_impl.super__Deque_impl_data._M_start._M_cur =
                   local_98._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
            }
            bVar2 = Tetris::onGround(&local_d0);
            if (bVar2) {
              __position._M_current = *(Tetris **)(this_00 + 8);
              if (__position._M_current == *(Tetris **)(this_00 + 0x10)) {
                std::vector<Tetris,std::allocator<Tetris>>::_M_realloc_insert<Tetris_const&>
                          (this_00,__position,&local_d0);
              }
              else {
                *(ulong *)&(__position._M_current)->color = CONCAT44(local_d0._36_4_,local_d0.color)
                ;
                (__position._M_current)->blockY = local_d0.blockY;
                (__position._M_current)->orientation = local_d0.orientation;
                (__position._M_current)->shape = local_d0.shape;
                (__position._M_current)->gameBoard = local_d0.gameBoard;
                (__position._M_current)->blockType = local_d0.blockType;
                (__position._M_current)->blockX = local_d0.blockX;
                *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x28;
              }
            }
            iVar10 = local_d0.blockY + 1;
            unaff_RBP = (ulong)(uint)local_d0.blockX;
            uVar7 = (ulong)(uint)local_d0.orientation;
            lVar5 = (long)local_d0.blockX;
            lVar9 = (long)local_d0.orientation;
            if ((*(char *)(lVar9 + lVar5 * 0x30 + (long)local_d0.blockY * 4 + 0x12ac84) == '\0') &&
               (local_d0.blockY = iVar10, bVar2 = Tetris::isValid(&local_d0,-1,-1,-1), bVar2)) {
              if (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_98._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                std::deque<Tetris,std::allocator<Tetris>>::_M_push_back_aux<Tetris_const&>
                          ((deque<Tetris,std::allocator<Tetris>> *)&local_98,&local_d0);
              }
              else {
                *(ulong *)&(local_98._M_impl.super__Deque_impl_data._M_finish._M_cur)->color =
                     CONCAT44(local_d0._36_4_,local_d0.color);
                (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur)->blockY = local_d0.blockY
                ;
                (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur)->orientation =
                     local_d0.orientation;
                (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur)->shape = local_d0.shape;
                (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur)->gameBoard =
                     local_d0.gameBoard;
                (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur)->blockType =
                     local_d0.blockType;
                (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur)->blockX = local_d0.blockX
                ;
                local_98._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_98._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
              }
              unaff_RBP = (ulong)(uint)local_d0.blockX;
              uVar7 = (ulong)(uint)local_d0.orientation;
              lVar5 = (long)local_d0.blockX;
              lVar9 = (long)local_d0.orientation;
              getPlaces::vis[lVar5][local_d0.blockY][lVar9] = true;
              iVar10 = local_d0.blockY;
            }
            iVar12 = iVar10 + -2;
            if ((*(char *)(lVar9 + lVar5 * 0x30 + 0x12ac78 + (long)iVar10 * 4) == '\0') &&
               (local_d0.blockY = iVar12, bVar2 = Tetris::isValid(&local_d0,-1,-1,-1), bVar2)) {
              if (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_98._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                std::deque<Tetris,std::allocator<Tetris>>::_M_push_back_aux<Tetris_const&>
                          ((deque<Tetris,std::allocator<Tetris>> *)&local_98,&local_d0);
              }
              else {
                *(ulong *)&(local_98._M_impl.super__Deque_impl_data._M_finish._M_cur)->color =
                     CONCAT44(local_d0._36_4_,local_d0.color);
                (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur)->blockY = local_d0.blockY
                ;
                (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur)->orientation =
                     local_d0.orientation;
                (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur)->shape = local_d0.shape;
                (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur)->gameBoard =
                     local_d0.gameBoard;
                (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur)->blockType =
                     local_d0.blockType;
                (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur)->blockX = local_d0.blockX
                ;
                local_98._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_98._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
              }
              unaff_RBP = (ulong)local_d0.blockX;
              uVar7 = (ulong)(uint)local_d0.orientation;
              lVar9 = (long)local_d0.orientation;
              getPlaces::vis[unaff_RBP][local_d0.blockY][lVar9] = true;
              iVar12 = local_d0.blockY;
            }
            local_d0.blockY = iVar12 + 1;
            uVar11 = (ulong)(uint)local_d0.blockY;
            local_d0.blockX = (int)unaff_RBP + -1;
            this_00 = local_a8;
            if (*(char *)(lVar9 + (long)local_d0.blockX * 0x30 + 0x12ac84 + (long)iVar12 * 4) ==
                '\0') {
              bVar2 = Tetris::isValid(&local_d0,-1,-1,-1);
              this_00 = local_a8;
              if (bVar2) {
                if (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                    local_98._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                  std::deque<Tetris,std::allocator<Tetris>>::_M_push_back_aux<Tetris_const&>
                            ((deque<Tetris,std::allocator<Tetris>> *)&local_98,&local_d0);
                }
                else {
                  *(ulong *)&(local_98._M_impl.super__Deque_impl_data._M_finish._M_cur)->color =
                       CONCAT44(local_d0._36_4_,local_d0.color);
                  (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur)->blockY =
                       local_d0.blockY;
                  (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur)->orientation =
                       local_d0.orientation;
                  (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur)->shape = local_d0.shape
                  ;
                  (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur)->gameBoard =
                       local_d0.gameBoard;
                  (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur)->blockType =
                       local_d0.blockType;
                  (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur)->blockX =
                       local_d0.blockX;
                  local_98._M_impl.super__Deque_impl_data._M_finish._M_cur =
                       local_98._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
                }
                uVar11 = (ulong)local_d0.blockY;
                uVar7 = (ulong)local_d0.orientation;
                getPlaces::vis[local_d0.blockX][uVar11][uVar7] = true;
                unaff_RBP = (ulong)(local_d0.blockX + 1);
              }
            }
          } while (local_9c == 6);
          iVar10 = (int)uVar7;
          uVar8 = iVar10 + 4;
          if (-1 < (int)(iVar10 + 1U)) {
            uVar8 = iVar10 + 1U;
          }
          iVar10 = (iVar10 - (uVar8 & 0xfffffffc)) + 1;
          local_d0.blockX = (int)unaff_RBP;
          bVar2 = Tetris::rotation(&local_d0,iVar10);
        } while ((!bVar2) || (getPlaces::vis[(int)unaff_RBP][(int)uVar11][iVar10] != false));
        local_d0.orientation = iVar10;
        if (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_98._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<Tetris,std::allocator<Tetris>>::_M_push_back_aux<Tetris_const&>
                    ((deque<Tetris,std::allocator<Tetris>> *)&local_98,&local_d0);
        }
        else {
          *(ulong *)&(local_98._M_impl.super__Deque_impl_data._M_finish._M_cur)->color =
               CONCAT44(local_d0._36_4_,local_d0.color);
          (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur)->blockY = local_d0.blockY;
          (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur)->orientation = iVar10;
          (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur)->shape = local_d0.shape;
          (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur)->gameBoard = local_d0.gameBoard
          ;
          (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur)->blockType = local_d0.blockType
          ;
          (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur)->blockX = local_d0.blockX;
          local_98._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_98._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
        unaff_RBP = (ulong)local_d0.blockX;
        uVar11 = (ulong)local_d0.blockY;
        uVar7 = (ulong)local_d0.orientation;
        getPlaces::vis[unaff_RBP][uVar11][uVar7] = true;
      } while( true );
    }
  } while( true );
}

Assistant:

vector<Tetris> &GameBoard::getPlaces(int id, int blockType, vector<Tetris> &ans, bool unique)
{
    queue<Tetris> q;
    static bool vis[MAPHEIGHT + 2][MAPWIDTH + 2][4];
    memset(vis, 0, sizeof(vis));
    Tetris tmp(this, blockType, id);
    int mh = MAPHEIGHT;
    while (1) {
        bool hv = false;
        for (int i = 1; i <= MAPWIDTH && !hv; ++i)
            if (gridInfo[id][mh][i] != 0)
                hv = true;
        if (hv)
            break;
        --mh;
    }
    for (int o = 0; o < 4; ++o) {
        int xo = MAPHEIGHT + blockHalfHeight[blockType][o] - blockHeight[blockType][o] + 1;
        xo = min(xo, mh + blockHeight[blockType][o] + 1);
        for (int y = 1; y <= MAPWIDTH; ++y)
            if (tmp.set(xo, y, o).isValid()) {
                q.push(tmp);
                vis[tmp.blockX][tmp.blockY][tmp.orientation] = true;
            }
    }
    //vector<Tetris> ans;
    while (!q.empty()) {
        auto &fr = q.front();
        tmp.set(fr.blockX, fr.blockY, fr.orientation);
        q.pop();
        if (tmp.onGround())
            ans.push_back(tmp);
        ++tmp.blockY;
        if (!vis[tmp.blockX][tmp.blockY][tmp.orientation] && tmp.isValid()) {
            q.push(tmp);
            vis[tmp.blockX][tmp.blockY][tmp.orientation] = true;
        }
        --tmp.blockY, --tmp.blockY;
        if (!vis[tmp.blockX][tmp.blockY][tmp.orientation] && tmp.isValid()) {
            q.push(tmp);
            vis[tmp.blockX][tmp.blockY][tmp.orientation] = true;
        }
        ++tmp.blockY, --tmp.blockX;
        if (!vis[tmp.blockX][tmp.blockY][tmp.orientation] && tmp.isValid()) {
            q.push(tmp);
            vis[tmp.blockX][tmp.blockY][tmp.orientation] = true;
        }
        ++tmp.blockX;
        if (blockType != 6) {
            int o2 = (tmp.orientation + 1) % 4;
            if (tmp.rotation(o2) && !vis[tmp.blockX][tmp.blockY][o2]) {
                tmp.orientation = o2;
                q.push(tmp);
                vis[tmp.blockX][tmp.blockY][tmp.orientation] = true;
            }
        }
    }
    /*if (!unique)
        return _ans = ans;
    _ans.clear();
    for (auto &i : ans) {
        bool hit = false;
        for (auto &t : _ans)
            if (i.same(t)) {
                hit = true;
                break;
            }
        if (!hit)
            _ans.push_back(i);
    }
    return _ans;*/
}